

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall FPathTraverse::AddLineIntercepts(FPathTraverse *this,int bx,int by)

{
  int iVar1;
  int iVar2;
  line_t_conflict *li;
  double dVar3;
  double dVar4;
  undefined1 local_98 [8];
  intercept_t newintercept;
  divline_t dl;
  double frac;
  int s2;
  int s1;
  line_t_conflict *ld;
  FBlockLinesIterator it;
  int by_local;
  int bx_local;
  FPathTraverse *this_local;
  
  it.list._0_4_ = by;
  it.list._4_4_ = bx;
  FBlockLinesIterator::FBlockLinesIterator((FBlockLinesIterator *)&ld,bx,by,bx,by,true);
  while (li = FBlockLinesIterator::Next((FBlockLinesIterator *)&ld), li != (line_t_conflict *)0x0) {
    dVar3 = vertex_t::fX(li->v1);
    dVar4 = vertex_t::fY(li->v1);
    iVar1 = P_PointOnDivlineSide(dVar3,dVar4,&this->trace);
    dVar3 = vertex_t::fX(li->v2);
    dVar4 = vertex_t::fY(li->v2);
    iVar2 = P_PointOnDivlineSide(dVar3,dVar4,&this->trace);
    if (iVar1 != iVar2) {
      P_MakeDivline((line_t *)li,(divline_t *)&newintercept.d);
      dVar3 = P_InterceptVector(&this->trace,(divline_t *)&newintercept.d);
      if ((this->Startfrac <= dVar3) && (dVar3 <= 1.0)) {
        newintercept.frac._0_1_ = 1;
        newintercept.frac._1_1_ = 0;
        local_98 = (undefined1  [8])dVar3;
        newintercept._8_8_ = li;
        TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)local_98);
      }
    }
  }
  return;
}

Assistant:

void FPathTraverse::AddLineIntercepts(int bx, int by)
{
	FBlockLinesIterator it(bx, by, bx, by, true);
	line_t *ld;

	while ((ld = it.Next()))
	{
		int 				s1;
		int 				s2;
		double 				frac;
		divline_t			dl;

		s1 = P_PointOnDivlineSide (ld->v1->fX(), ld->v1->fY(), &trace);
		s2 = P_PointOnDivlineSide (ld->v2->fX(), ld->v2->fY(), &trace);
		
		if (s1 == s2) continue;	// line isn't crossed
		
		// hit the line
		P_MakeDivline (ld, &dl);
		frac = P_InterceptVector (&trace, &dl);

		if (frac < Startfrac || frac > 1.) continue;	// behind source or beyond end point
			
		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push (newintercept);
	}
}